

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void av1_adjust_gf_refresh_qp_one_pass_rt(AV1_COMP *cpi)

{
  int16_t *piVar1;
  bool bVar2;
  int iVar3;
  AV1_COMP *in_RDI;
  int ref_frame_map_idx;
  uint i;
  int refresh_mask;
  int thresh;
  int gf_update_changed;
  int allow_gf_update;
  int avg_qp;
  PRIMARY_RATE_CONTROL *p_rc;
  int resize_pending;
  RTC_REF *rtc_ref;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  uint local_48;
  uint local_44;
  AV1_COMP *cpi_00;
  
  cpi_00 = (AV1_COMP *)&in_RDI->ppi->rtc_ref;
  iVar3 = is_frame_resize_pending(in_RDI);
  if ((iVar3 == 0) && ((in_RDI->rc).high_source_sad == 0)) {
    iVar3 = (in_RDI->ppi->p_rc).avg_frame_qindex[1];
    bVar2 = false;
    if (((in_RDI->common).current_frame.frame_number - (in_RDI->rc).frame_num_last_gf_refresh < 0x50
        ) && (((in_RDI->rc).frames_till_gf_update_due == 1 &&
              (iVar3 < (in_RDI->common).quant_params.base_qindex)))) {
      piVar1 = (cpi_00->enc_quant_dequant_params).quants.y_quant[2] +
               (long)*(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[5] + 6) * 2 + 4;
      piVar1[0] = 0;
      piVar1[1] = 0;
      bVar2 = true;
      (in_RDI->refresh_frame).golden_frame = false;
    }
    else if (((in_RDI->rc).frames_till_gf_update_due <=
              (in_RDI->ppi->p_rc).baseline_gf_interval + -10) &&
            (((in_RDI->common).quant_params.base_qindex < (iVar3 * 0x57) / 100 ||
             (((in_RDI->rc).avg_frame_low_motion != 0 && ((in_RDI->rc).avg_frame_low_motion < 0x14))
             )))) {
      piVar1 = (cpi_00->enc_quant_dequant_params).quants.y_quant[2] +
               (long)*(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[5] + 6) * 2 + 4;
      piVar1[0] = 1;
      piVar1[1] = 0;
      bVar2 = true;
      (in_RDI->refresh_frame).golden_frame = true;
    }
    if (bVar2) {
      set_baseline_gf_interval(cpi_00,'\0');
      local_44 = 0;
      for (local_48 = 0; local_48 < 7; local_48 = local_48 + 1) {
        iVar3 = *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0] +
                        (ulong)local_48 * 2 + 6);
        local_44 = *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[2] +
                           (long)iVar3 * 2 + 4) << ((byte)iVar3 & 0x1f) | local_44;
      }
      (in_RDI->common).current_frame.refresh_frame_flags = local_44;
    }
  }
  return;
}

Assistant:

void av1_adjust_gf_refresh_qp_one_pass_rt(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  RATE_CONTROL *const rc = &cpi->rc;
  RTC_REF *const rtc_ref = &cpi->ppi->rtc_ref;
  const int resize_pending = is_frame_resize_pending(cpi);
  if (!resize_pending && !rc->high_source_sad) {
    // Check if we should disable GF refresh (if period is up),
    // or force a GF refresh update (if we are at least halfway through
    // period) based on QP. Look into add info on segment deltaq.
    PRIMARY_RATE_CONTROL *p_rc = &cpi->ppi->p_rc;
    const int avg_qp = p_rc->avg_frame_qindex[INTER_FRAME];
    const int allow_gf_update =
        rc->frames_till_gf_update_due <= (p_rc->baseline_gf_interval - 10);
    int gf_update_changed = 0;
    int thresh = 87;
    if ((cm->current_frame.frame_number - cpi->rc.frame_num_last_gf_refresh) <
            FIXED_GF_INTERVAL_RT &&
        rc->frames_till_gf_update_due == 1 &&
        cm->quant_params.base_qindex > avg_qp) {
      // Disable GF refresh since QP is above the running average QP.
      rtc_ref->refresh[rtc_ref->gld_idx_1layer] = 0;
      gf_update_changed = 1;
      cpi->refresh_frame.golden_frame = 0;
    } else if (allow_gf_update &&
               ((cm->quant_params.base_qindex < thresh * avg_qp / 100) ||
                (rc->avg_frame_low_motion && rc->avg_frame_low_motion < 20))) {
      // Force refresh since QP is well below average QP or this is a high
      // motion frame.
      rtc_ref->refresh[rtc_ref->gld_idx_1layer] = 1;
      gf_update_changed = 1;
      cpi->refresh_frame.golden_frame = 1;
    }
    if (gf_update_changed) {
      set_baseline_gf_interval(cpi, INTER_FRAME);
      int refresh_mask = 0;
      for (unsigned int i = 0; i < INTER_REFS_PER_FRAME; i++) {
        int ref_frame_map_idx = rtc_ref->ref_idx[i];
        refresh_mask |= rtc_ref->refresh[ref_frame_map_idx]
                        << ref_frame_map_idx;
      }
      cm->current_frame.refresh_frame_flags = refresh_mask;
    }
  }
}